

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O0

mpt_data_decoder_t mpt_message_decoder(int code)

{
  code *pcStack_10;
  int code_local;
  
  switch(code & 0x7f) {
  case 0:
    pcStack_10 = (mpt_data_decoder_t)0x0;
    break;
  case 1:
    pcStack_10 = mpt_decode_command;
    break;
  case 2:
    pcStack_10 = mpt_decode_cobs;
    break;
  case 3:
    pcStack_10 = mpt_decode_cobs_r;
    break;
  default:
    pcStack_10 = (mpt_data_decoder_t)0x0;
    break;
  case 6:
    pcStack_10 = mpt_decode_cobs_zpe;
    break;
  case 7:
    pcStack_10 = mpt_decode_cobs_zpe_r;
  }
  return pcStack_10;
}

Assistant:

extern MPT_TYPE(data_decoder) mpt_message_decoder(int code)
{
	switch (code & 0x7f) {
	  /* no encoding */
	  case 0:
	    return 0;
	  /* text message format */
	  case MPT_ENUM(EncodingCommand):
	    return mpt_decode_command;
	  /* normal COBS output */
	  case MPT_ENUM(EncodingCobs):
	    return mpt_decode_cobs;
	  /* COBS with tail inline */
	  case MPT_ENUM(EncodingCobsInline):
	    return mpt_decode_cobs_r;
	  /* compressed COBS output */
	  case MPT_ENUM(EncodingCobs) | MPT_ENUM(EncodingCompress):
	    return mpt_decode_cobs_zpe;
	  /* compressed COBS with tail inline */
	  case MPT_ENUM(EncodingCobsInline) | MPT_ENUM(EncodingCompress):
	    return mpt_decode_cobs_zpe_r;
	  /* invalid encoding */
	  default: return 0;
	}
}